

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

void __thiscall
anurbs::NurbsSurfaceGeometry<2L>::set_weights
          (NurbsSurfaceGeometry<2L> *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *value)

{
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *value_local;
  NurbsSurfaceGeometry<2L> *this_local;
  
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->m_weights,
             (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)value);
  return;
}

Assistant:

void set_weights(Eigen::Ref<const Weights> value)
    {
        m_weights = value;
    }